

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> *
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Int
          (cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> *__return_storage_ptr__,
          ReadFileResult success,ReadFileResult fail,int defval)

{
  anon_class_12_3_5a0d8fdd local_28;
  int local_1c;
  ReadFileResult local_18;
  int defval_local;
  ReadFileResult fail_local;
  ReadFileResult success_local;
  
  local_28.success = success;
  local_28.fail = fail;
  local_28.defval = defval;
  local_1c = defval;
  local_18 = fail;
  defval_local = success;
  _fail_local = __return_storage_ptr__;
  std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Int(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,int)::_lambda(int&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)> *)
             __return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<int, E, CallState...> Int(E success, E fail,
                                                int defval = 0)
  {
    return [success, fail, defval](int& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isInt()) {
        return fail;
      }
      out = value->asInt();
      return success;
    };
  }